

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

JSValue js_string_constructor(JSContext *ctx,JSValue new_target,int argc,JSValue *argv)

{
  JSValue val_00;
  JSValue val_01;
  JSValue obj_00;
  JSValue val_02;
  JSValue str2;
  JSValue this_obj;
  JSValue v;
  JSValue v_00;
  JSValue JVar1;
  int iVar2;
  int in_ECX;
  int64_t in_RDX;
  JSValueUnion in_RSI;
  long in_RDI;
  JSValue *in_R8;
  JSValue JVar3;
  JSString *p1;
  JSAtomStruct *p;
  JSValue obj;
  JSValue val;
  undefined4 in_stack_fffffffffffffef8;
  JSAtom in_stack_fffffffffffffefc;
  JSContext *in_stack_ffffffffffffff00;
  JSContext *in_stack_ffffffffffffff18;
  JSValueUnion in_stack_ffffffffffffff20;
  JSValueUnion JVar4;
  JSValueUnion JVar5;
  JSValue in_stack_ffffffffffffff40;
  undefined1 auVar6 [12];
  JSValueUnion in_stack_ffffffffffffff50;
  JSValueUnion in_stack_ffffffffffffff58;
  JSValueUnion in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff68;
  int in_stack_ffffffffffffff6c;
  JSContext *in_stack_ffffffffffffff70;
  JSValue in_stack_ffffffffffffff78;
  JSValueUnion local_68;
  JSValueUnion local_60;
  JSValueUnion local_30;
  JSValueUnion local_28;
  
  if (in_ECX == 0) {
    in_stack_ffffffffffffff78 = JS_AtomToString(in_stack_ffffffffffffff00,in_stack_fffffffffffffefc)
    ;
    auVar6 = in_stack_ffffffffffffff40._4_12_;
    local_68 = in_stack_ffffffffffffff78.u;
    local_60 = (JSValueUnion)in_stack_ffffffffffffff78.tag;
  }
  else {
    JVar3.tag = in_RDX;
    JVar3.u.ptr = in_RSI.ptr;
    iVar2 = JS_IsUndefined(JVar3);
    if ((iVar2 == 0) || (iVar2 = JS_IsSymbol(*in_R8), iVar2 == 0)) {
      val_00.u._4_4_ = in_stack_fffffffffffffefc;
      val_00.u.int32 = in_stack_fffffffffffffef8;
      val_00.tag = (int64_t)in_stack_ffffffffffffff00;
      in_stack_ffffffffffffff40 = JS_ToString((JSContext *)0x14f7a4,val_00);
      local_68 = in_stack_ffffffffffffff40.u;
      local_60 = (JSValueUnion)in_stack_ffffffffffffff40.tag;
    }
    else {
      in_stack_ffffffffffffff70 = (JSContext *)(in_R8->u).ptr;
      js_get_atom_index(*(JSRuntime **)(in_RDI + 0x18),(JSAtomStruct *)in_stack_ffffffffffffff70);
      JVar3 = JS_AtomToString(in_stack_ffffffffffffff00,in_stack_fffffffffffffefc);
      in_stack_ffffffffffffff50 = JVar3.u;
      in_stack_ffffffffffffff58 = (JSValueUnion)JVar3.tag;
      str2.tag = (int64_t)in_stack_ffffffffffffff60.ptr;
      str2.u = (JSValueUnion)(JSValueUnion)in_stack_ffffffffffffff58.ptr;
      JVar3 = JS_ConcatString3((JSContext *)in_stack_ffffffffffffff50.ptr,
                               (char *)in_stack_ffffffffffffff40.tag,str2,
                               (char *)in_stack_ffffffffffffff40.u.ptr);
      in_stack_ffffffffffffff60 = JVar3.u;
      in_stack_ffffffffffffff68 = (undefined4)JVar3.tag;
      in_stack_ffffffffffffff6c = JVar3.tag._4_4_;
      local_60 = (JSValueUnion)JVar3.tag;
      local_68 = in_stack_ffffffffffffff60;
    }
    auVar6 = in_stack_ffffffffffffff40._4_12_;
    v.tag = (int64_t)local_60.ptr;
    v.u.ptr = local_68.ptr;
    iVar2 = JS_IsException(v);
    if (iVar2 != 0) {
      local_30.float64 = local_68.float64;
      local_28.float64 = local_60.float64;
      goto LAB_0014f98c;
    }
  }
  v_00.tag = in_RDX;
  v_00.u.ptr = in_RSI.ptr;
  iVar2 = JS_IsUndefined(v_00);
  if (iVar2 == 0) {
    JVar3 = js_create_from_ctor(in_stack_ffffffffffffff70,in_stack_ffffffffffffff78,
                                in_stack_ffffffffffffff6c);
    local_30 = JVar3.u;
    local_28 = (JSValueUnion)JVar3.tag;
    JVar4 = local_30;
    JVar5 = local_28;
    iVar2 = JS_IsException(JVar3);
    if (iVar2 == 0) {
      obj_00.tag = (int64_t)local_68.ptr;
      obj_00.u.ptr = JVar5.ptr;
      val_01.tag = (int64_t)JVar4.ptr;
      val_01.u.float64 = in_stack_ffffffffffffff20.float64;
      JS_SetObjectData(in_stack_ffffffffffffff18,obj_00,val_01);
      this_obj.tag._0_4_ = in_stack_ffffffffffffff68;
      this_obj.u.float64 = in_stack_ffffffffffffff60.float64;
      this_obj.tag._4_4_ = in_stack_ffffffffffffff6c;
      val_02.tag = (int64_t)in_stack_ffffffffffffff58.ptr;
      val_02.u.float64 = in_stack_ffffffffffffff50.float64;
      JS_DefinePropertyValue
                (auVar6._4_8_,this_obj,auVar6._0_4_,val_02,(int)in_stack_ffffffffffffff78.tag);
    }
  }
  else {
    local_30.float64 = local_68.float64;
    local_28 = local_60;
  }
LAB_0014f98c:
  JVar1.tag = (int64_t)local_28.ptr;
  JVar1.u.float64 = local_30.float64;
  return JVar1;
}

Assistant:

static JSValue js_string_constructor(JSContext *ctx, JSValueConst new_target,
                                     int argc, JSValueConst *argv)
{
    JSValue val, obj;
    if (argc == 0) {
        val = JS_AtomToString(ctx, JS_ATOM_empty_string);
    } else {
        if (JS_IsUndefined(new_target) && JS_IsSymbol(argv[0])) {
            JSAtomStruct *p = JS_VALUE_GET_PTR(argv[0]);
            val = JS_ConcatString3(ctx, "Symbol(", JS_AtomToString(ctx, js_get_atom_index(ctx->rt, p)), ")");
        } else {
            val = JS_ToString(ctx, argv[0]);
        }
        if (JS_IsException(val))
            return val;
    }
    if (!JS_IsUndefined(new_target)) {
        JSString *p1 = JS_VALUE_GET_STRING(val);

        obj = js_create_from_ctor(ctx, new_target, JS_CLASS_STRING);
        if (!JS_IsException(obj)) {
            JS_SetObjectData(ctx, obj, val);
            JS_DefinePropertyValue(ctx, obj, JS_ATOM_length, JS_NewInt32(ctx, p1->len), 0);
        }
        return obj;
    } else {
        return val;
    }
}